

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O0

void leveldb::ThreadBody(void *arg)

{
  State *s;
  void *arg_local;
  
  port::Mutex::Lock((Mutex *)arg);
  *(int *)((long)arg + 0x60) = *(int *)((long)arg + 0x60) + 1;
  *(int *)((long)arg + 100) = *(int *)((long)arg + 100) + -1;
  port::CondVar::Signal((CondVar *)((long)arg + 0x28));
  port::Mutex::Unlock((Mutex *)arg);
  return;
}

Assistant:

static void ThreadBody(void* arg) {
  State* s = reinterpret_cast<State*>(arg);
  s->mu.Lock();
  s->val += 1;
  s->num_running -= 1;
  s->cvar.Signal();
  s->mu.Unlock();
}